

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::OptionSectionParser::parseLine
          (OptionSectionParser *this,ForceField *param_1,string *line,int lineNo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string optionName;
  string optionValue;
  StringTokenizer tokenizer;
  string local_b8;
  string local_98;
  StringTokenizer local_78;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_78,line,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_78);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,"OptionSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    ForceFieldOptions::setData(this->options_,&local_b8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.delim_._M_dataplus._M_p != &local_78.delim_.field_2) {
    operator_delete(local_78.delim_._M_dataplus._M_p,
                    local_78.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tokenString_._M_dataplus._M_p != &local_78.tokenString_.field_2) {
    operator_delete(local_78.tokenString_._M_dataplus._M_p,
                    local_78.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OptionSectionParser::parseLine(ForceField&, const std::string& line,
                                      int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string optionName  = tokenizer.nextToken();
      std::string optionValue = tokenizer.nextToken();

      options_.setData(optionName, optionValue);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "OptionSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }
  }